

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O0

JsonToken * json::JsonLexer::nextToken(JsonToken *__return_storage_ptr__,istream *input)

{
  bool bVar1;
  istream *piVar2;
  runtime_error *this;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  int __fd;
  allocator local_149;
  string local_148 [32];
  char local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  JsonLexer local_e8 [32];
  JsonLexer local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  char local_19;
  istream *piStack_18;
  char c;
  istream *input_local;
  
  piStack_18 = input;
  input_local = (istream *)__return_storage_ptr__;
  piVar2 = std::operator>>(input,&local_19);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    __fd = (int)piStack_18;
    switch(local_19) {
    case '\"':
      readString_abi_cxx11_(local_e8,piStack_18);
      JsonToken::JsonToken(__return_storage_ptr__,String,(string *)local_e8);
      std::__cxx11::string::~string((string *)local_e8);
      break;
    default:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,1,local_19,&local_149);
      std::operator+(local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Found illegal character: \'");
      std::operator+(local_108,local_128);
      std::runtime_error::runtime_error(this,(string *)local_108);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case ',':
      JsonToken::JsonToken(__return_storage_ptr__,ValueSeparator);
      break;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      readNumber_abi_cxx11_(local_c8,piStack_18,local_19);
      JsonToken::JsonToken(__return_storage_ptr__,Number,(string *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      break;
    case ':':
      JsonToken::JsonToken(__return_storage_ptr__,NameSeparator);
      break;
    case '[':
      JsonToken::JsonToken(__return_storage_ptr__,BeginArray);
      break;
    case ']':
      JsonToken::JsonToken(__return_storage_ptr__,EndArray);
      break;
    case 'f':
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"alse",&local_41);
      read(__fd,local_40,__nbytes);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      JsonToken::JsonToken(__return_storage_ptr__,False);
      break;
    case 'n':
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"ull",&local_a1);
      read(__fd,local_a0,__nbytes_01);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      JsonToken::JsonToken(__return_storage_ptr__,Null);
      break;
    case 't':
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"rue",&local_79);
      read(__fd,local_78,__nbytes_00);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      JsonToken::JsonToken(__return_storage_ptr__,True);
      break;
    case '{':
      JsonToken::JsonToken(__return_storage_ptr__,BeginObject);
      break;
    case '}':
      JsonToken::JsonToken(__return_storage_ptr__,EndObject);
    }
  }
  else {
    JsonToken::JsonToken(__return_storage_ptr__,EndOfFile);
  }
  return __return_storage_ptr__;
}

Assistant:

JsonToken JsonLexer::nextToken(std::istream &input)
    {
        char c;

        if (input >> c)
        {
            switch (c)
            {
            case '[':
                return {JsonTokenType::BeginArray};
            case '{':
                return {JsonTokenType::BeginObject};
            case ']':
                return {JsonTokenType::EndArray};
            case '}':
                return {JsonTokenType::EndObject};
            case ':':
                return {JsonTokenType::NameSeparator};
            case ',':
                return {JsonTokenType::ValueSeparator};
            case 'f':
                read(input, "alse"); // Make sure that the next characters in the stream are 'a', 'l', 's' and 'e'.
                return {JsonTokenType::False};
            case 't':
                read(input, "rue");
                return {JsonTokenType::True};
            case 'n':
                read(input, "ull");
                return {JsonTokenType::Null};
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return {JsonTokenType::Number, readNumber(input, c)};
            case '\"':
                return {JsonTokenType::String, readString(input)};
            default:
                throw std::runtime_error("Found illegal character: '" + std::string(1, c) + "'");
            }
        }

        return {JsonTokenType::EndOfFile};
    }